

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::tracker_error_alert::tracker_error_alert
          (tracker_error_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,int times
          ,string_view u,error_code *e,string_view m)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  int iVar5;
  error_category *peVar6;
  
  tracker_alert::tracker_alert(&this->super_tracker_alert,alloc,h,ep,u);
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__tracker_error_alert_004559e0;
  this->times_in_row = times;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  aVar4 = aux::stack_allocator::copy_string(alloc,m);
  (this->m_msg_idx).m_idx = aVar4.m_idx;
  iVar5 = -1;
  if (e->failed_ == true) {
    peVar1 = e->cat_;
    peVar6 = http_category();
    bVar2 = peVar1->id_ == peVar6->id_;
    if (peVar6->id_ == 0) {
      bVar2 = peVar1 == peVar6;
    }
    iVar5 = -1;
    if (bVar2) {
      iVar5 = e->val_;
    }
  }
  this->status_code = iVar5;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->msg,m.ptr_,m.ptr_ + m.len_);
  return;
}

Assistant:

tracker_error_alert::tracker_error_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, tcp::endpoint const& ep, int times
		, string_view u, error_code const& e, string_view m)
		: tracker_alert(alloc, h, ep, u)
		, times_in_row(times)
		, error(e)
		, m_msg_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, status_code(e && e.category() == http_category() ? e.value() : -1)
		, msg(m)
#endif
	{
		TORRENT_ASSERT(!u.empty());
	}